

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O0

void nvlist_move_string(nvlist_t *nvl,char *name,char *value)

{
  int iVar1;
  int *piVar2;
  nvpair_t *nvp_00;
  int local_30;
  nvpair_t *nvp;
  char *value_local;
  char *name_local;
  nvlist_t *nvl_local;
  
  iVar1 = nvlist_error(nvl);
  if (iVar1 == 0) {
    nvp_00 = nvpair_move_string(name,value);
    if (nvp_00 == (nvpair_t *)0x0) {
      piVar2 = __errno_location();
      if (*piVar2 == 0) {
        local_30 = 0xc;
      }
      else {
        piVar2 = __errno_location();
        local_30 = *piVar2;
      }
      nvl->nvl_error = local_30;
      iVar1 = nvl->nvl_error;
      piVar2 = __errno_location();
      *piVar2 = iVar1;
    }
    else {
      nvlist_move_nvpair(nvl,nvp_00);
    }
  }
  else {
    free(value);
    iVar1 = nvlist_error(nvl);
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

void
nvlist_move_string(nvlist_t *nvl, const char *name, char *value)
{
	nvpair_t *nvp;

	if (nvlist_error(nvl) != 0) {
		nv_free(value);
		ERRNO_SET(nvlist_error(nvl));
		return;
	}

	nvp = nvpair_move_string(name, value);
	if (nvp == NULL) {
		nvl->nvl_error = ERRNO_OR_DEFAULT(ENOMEM);
		ERRNO_SET(nvl->nvl_error);
	} else {
		(void)nvlist_move_nvpair(nvl, nvp);
	}
}